

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O0

void __thiscall
re::fft::simd_fft<float,_256L>::stage_2n
          (simd_fft<float,_256L> *this,span<std::complex<float>,_256L> out,int_t stage)

{
  lane<std::complex<float>_> b;
  lane<std::complex<float>_> b_00;
  lane<std::complex<float>_> b_01;
  lane<std::complex<float>_> b_02;
  lane<std::complex<float>_> b_03;
  lane<std::complex<float>_> b_04;
  lane<std::complex<float>_> b_05;
  lane<std::complex<float>_> b_06;
  lane<std::complex<float>_> b_07;
  lane<std::complex<float>_> b_08;
  lane<std::complex<float>_> b_09;
  lane<std::complex<float>_> b_10;
  lane<std::complex<float>_> b_11;
  lane<std::complex<float>_> a;
  lane<std::complex<float>_> a_00;
  lane<std::complex<float>_> a_01;
  lane<std::complex<float>_> a_02;
  lane<std::complex<float>_> a_03;
  lane<std::complex<float>_> a_04;
  lane<std::complex<float>_> a_05;
  lane<std::complex<float>_> a_06;
  lane<std::complex<float>_> a_07;
  lane<std::complex<float>_> a_08;
  lane<std::complex<float>_> a_09;
  lane<std::complex<float>_> a_10;
  lane<std::complex<float>_> a_11;
  lane<std::complex<float>_> value;
  lane<std::complex<float>_> value_00;
  lane<std::complex<float>_> value_01;
  lane<std::complex<float>_> value_02;
  int iVar1;
  byte in_DL;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  lane<std::complex<float>_> w_x_d;
  lane<std::complex<float>_> w_x_c;
  lane<std::complex<float>_> w_x_b;
  lane<std::complex<float>_> x_d;
  lane<std::complex<float>_> x_c;
  lane<std::complex<float>_> x_b;
  lane<std::complex<float>_> x_a;
  int i;
  lane<std::complex<float>_> w3;
  lane<std::complex<float>_> w2;
  lane<std::complex<float>_> w1;
  int j;
  int stride;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 local_6c;
  undefined4 local_20;
  
  iVar1 = 1 << (in_DL & 0x1f);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    std::array<std::complex<float>,_128UL>::operator[]
              ((array<std::complex<float>,_128UL> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    simd::load<std::complex<float>>
              ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    a.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
    a.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
    b.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
    b.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
    simd::intrinsics::mul<std::complex<float>_>::operator()
              ((mul<std::complex<float>_> *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a,b);
    a_00.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
    a_00.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
    b_00.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
    b_00.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
    simd::intrinsics::mul<std::complex<float>_>::operator()
              ((mul<std::complex<float>_> *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_00,b_00);
    for (local_6c = 0; local_6c < 0x100; local_6c = iVar1 * 4 + local_6c) {
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      simd::load<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      simd::load<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      simd::load<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      simd::load<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      a_01.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_01.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_01.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_01.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::mul<std::complex<float>_>::operator()
                ((mul<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_01,b_01);
      a_02.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_02.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_02.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_02.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::mul<std::complex<float>_>::operator()
                ((mul<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_02,b_02);
      a_03.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_03.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_03.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_03.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::mul<std::complex<float>_>::operator()
                ((mul<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_03,b_03);
      a_04.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_04.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_04.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_04.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::sub<std::complex<float>_>::operator()
                ((sub<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_04,b_04);
      a_05.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_05.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_05.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_05.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::add<std::complex<float>_>::operator()
                ((add<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_05,b_05);
      a_06.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_06.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_06.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_06.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::sub<std::complex<float>_>::operator()
                ((sub<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_06,b_06);
      a_07.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_07.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_07.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_07.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::add<std::complex<float>_>::operator()
                ((add<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_07,b_07);
      a_08.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_08.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_08.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_08.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::sub<std::complex<float>_>::operator()
                ((sub<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_08,b_08);
      a_09.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_09.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_09.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_09.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::add<std::complex<float>_>::operator()
                ((add<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_09,b_09);
      a_10.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcdc;
      a_10.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd8;
      b_10.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_10.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      simd::intrinsics::sub<std::complex<float>_>::operator()
                ((sub<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_10,b_10);
      a_11.a._M_elems[0]._M_value._4_4_ = extraout_XMM0_Db;
      a_11.a._M_elems[0]._M_value._0_4_ = extraout_XMM0_Da;
      b_11.a._M_elems[0]._M_value._4_4_ = in_stack_fffffffffffffcd4;
      b_11.a._M_elems[0]._M_value._0_4_ = in_stack_fffffffffffffcd0;
      in_stack_fffffffffffffcd8 = extraout_XMM0_Da;
      in_stack_fffffffffffffcdc = extraout_XMM0_Db;
      uVar2 = extraout_XMM0_Dc;
      uVar3 = extraout_XMM0_Dd;
      simd::intrinsics::add<std::complex<float>_>::operator()
                ((add<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),a_11,b_11);
      in_stack_fffffffffffffcc8 = extraout_XMM0_Da_00;
      in_stack_fffffffffffffccc = extraout_XMM0_Db_00;
      in_stack_fffffffffffffcd0 = extraout_XMM0_Dc_00;
      in_stack_fffffffffffffcd4 = extraout_XMM0_Dd_00;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00),
                 CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      value.a._M_elems[0]._M_value._4_4_ = uVar3;
      value.a._M_elems[0]._M_value._0_4_ = uVar2;
      simd::store<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 value);
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      value_00.a._M_elems[0]._M_value._4_4_ = uVar3;
      value_00.a._M_elems[0]._M_value._0_4_ = uVar2;
      simd::store<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 value_00);
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      value_01.a._M_elems[0]._M_value._4_4_ = uVar3;
      value_01.a._M_elems[0]._M_value._0_4_ = uVar2;
      simd::store<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 value_01);
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      value_02.a._M_elems[0]._M_value._4_4_ = uVar3;
      value_02.a._M_elems[0]._M_value._0_4_ = uVar2;
      simd::store<std::complex<float>>
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 value_02);
    }
  }
  return;
}

Assistant:

void stage_2n(gsl::span<cpx_t, N> out, int_t stage) const noexcept {
        auto const stride = 1 << stage;

        for (auto j = 0; j < stride; j += simd::width<cpx_t>) {
            auto w1 = simd::load(&w_twiddles[j]);
            auto w2 = simd::intrinsics::mul<cpx_t>()(w1, w1);
            auto w3 = simd::intrinsics::mul<cpx_t>()(w1, w2);

            for (auto i = 0; i < N; i += 4*stride) {
                auto x_a = simd::load(&out[j + i + 0 * stride]);
                auto x_b = simd::load(&out[j + i + 1 * stride]);
                auto x_c = simd::load(&out[j + i + 2 * stride]);
                auto x_d = simd::load(&out[j + i + 3 * stride]);

                auto w_x_b = simd::intrinsics::mul<cpx_t>()(x_b, w1);
                auto w_x_c = simd::intrinsics::mul<cpx_t>()(x_c, w2);
                auto w_x_d = simd::intrinsics::mul<cpx_t>()(x_d, w3);

                x_d = simd::intrinsics::sub<cpx_t>()(w_x_c, w_x_d);
                x_c = simd::intrinsics::add<cpx_t>()(w_x_c, w_x_d);
                x_b = simd::intrinsics::sub<cpx_t>()(x_a, w_x_b);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_b);

                w_x_d = x_d;
                x_d = simd::intrinsics::sub<cpx_t>()(x_b, w_x_d);
                x_b = simd::intrinsics::add<cpx_t>()(x_b, w_x_d);

                w_x_c = x_c;
                x_c = simd::intrinsics::sub<cpx_t>()(x_a, w_x_c);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_c);

                simd::store(&out[j + i + 0 * stride], x_a);
                simd::store(&out[j + i + 1 * stride], x_b);
                simd::store(&out[j + i + 2 * stride], x_c);
                simd::store(&out[j + i + 3 * stride], x_d);
            }
        }
    }